

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BytecodeIO.cpp
# Opt level: O2

bool BytecodeIO::readBytecode
               (string *filepath,vector<unsigned_int,_std::allocator<unsigned_int>_> *bytecode)

{
  char cVar1;
  ulong uVar2;
  ifstream file;
  
  std::ifstream::ifstream((string *)&file);
  std::ifstream::open((string *)&file,(_Ios_Openmode)filepath);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    uVar2 = std::istream::tellg();
    std::istream::seekg((long)&file,_S_beg);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize(bytecode,uVar2 >> 2);
    std::istream::read((char *)&file,
                       (long)(bytecode->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_start);
    std::ifstream::close();
  }
  std::ifstream::~ifstream(&file);
  return (bool)cVar1;
}

Assistant:

bool BytecodeIO::readBytecode(const std::string& filepath, std::vector<unsigned int>& bytecode)
{
    //Open the file
    std::ifstream file;
    file.open(filepath, std::ios::in | std::ios::binary | std::ios::ate);
    if(!file.is_open())
        return false;

    //Get file size
    std::streampos fileSize = file.tellg();
    file.seekg(0, std::ios::beg);

    //Reserve space in the vector and read the data
    bytecode.resize(fileSize / sizeof(decltype(bytecode.begin())::value_type));
    file.read((char*)&bytecode[0], fileSize);

    file.close();
    return true;
}